

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

void Res_WinComputeRoots_rec(Abc_Obj_t *pNode,int nLevelMax,int nFanoutLimit,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanout;
  Vec_Ptr_t *vRoots_local;
  int nFanoutLimit_local;
  int nLevelMax_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    iVar1 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      iVar1 = Res_WinComputeRootsCheck(pNode,nLevelMax,nFanoutLimit);
      if (iVar1 == 0) {
        for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_2c < iVar1;
            local_2c = local_2c + 1) {
          pNode_00 = Abc_ObjFanout(pNode,local_2c);
          Res_WinComputeRoots_rec(pNode_00,nLevelMax,nFanoutLimit,vRoots);
        }
      }
      else {
        Vec_PtrPush(vRoots,pNode);
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                ,200,"void Res_WinComputeRoots_rec(Abc_Obj_t *, int, int, Vec_Ptr_t *)");
}

Assistant:

void Res_WinComputeRoots_rec( Abc_Obj_t * pNode, int nLevelMax, int nFanoutLimit, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // check if the node should be the root
    if ( Res_WinComputeRootsCheck( pNode, nLevelMax, nFanoutLimit ) )
        Vec_PtrPush( vRoots, pNode );
    else // if not, explore its fanouts
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Res_WinComputeRoots_rec( pFanout, nLevelMax, nFanoutLimit, vRoots );
}